

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformValue::streamValue
          (UniformValue *this,ostringstream *str,int arrayElement,int column)

{
  bool bVar1;
  GLenum GVar2;
  pair<int,_int> pVar3;
  string *psVar4;
  ostream *poVar5;
  const_reference pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  int local_6c;
  int local_64;
  int iStack_60;
  int elem_3;
  int local_58;
  int iStack_54;
  int elem_2;
  int local_4c;
  int local_44;
  ulong uStack_40;
  int elem_1;
  size_t elem;
  int iStack_30;
  int local_2c;
  int arrayElementSize;
  int column_local;
  int arrayElement_local;
  ostringstream *str_local;
  UniformValue *this_local;
  
  pVar3 = UniformType::getSize(&this->type);
  local_2c = pVar3.first;
  pVar3 = UniformType::getSize(&this->type);
  iStack_30 = pVar3.second;
  local_2c = local_2c * iStack_30;
  psVar4 = glcts::(anonymous_namespace)::UniformType::refStr_abi_cxx11_((UniformType *)&this->type);
  poVar5 = std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,(string *)psVar4
                          );
  std::operator<<(poVar5,"(");
  GVar2 = UniformType::getBaseType(&this->type);
  if (GVar2 == 0x82e6) {
    for (uStack_40 = 0; uStack_40 < 4; uStack_40 = uStack_40 + 1) {
      if (uStack_40 != 0) {
        std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->fValues,(long)(arrayElement << 2) + uStack_40);
      std::ostream::operator<<(str,*pvVar6);
    }
    std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,")");
  }
  else {
    local_44 = 0;
    while( true ) {
      sVar7 = std::vector<float,_std::allocator<float>_>::size(&this->fValues);
      bVar1 = false;
      if (sVar7 != 0) {
        pVar3 = UniformType::getSize(&this->type);
        local_4c = pVar3.first;
        bVar1 = local_44 < local_4c;
      }
      if (!bVar1) break;
      if (local_44 != 0) {
        std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      pVar3 = UniformType::getSize(&this->type);
      iStack_54 = pVar3.first;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->fValues,
                          (long)(arrayElement * local_2c + column * iStack_54 + local_44));
      poVar5 = (ostream *)std::ostream::operator<<(str,*pvVar6);
      std::operator<<(poVar5,".0");
      local_44 = local_44 + 1;
    }
    local_58 = 0;
    while( true ) {
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->iValues);
      bVar1 = false;
      if (sVar7 != 0) {
        pVar3 = UniformType::getSize(&this->type);
        iStack_60 = pVar3.first;
        bVar1 = local_58 < iStack_60;
      }
      if (!bVar1) break;
      if (local_58 != 0) {
        std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->iValues,(long)(arrayElement * local_2c + local_58));
      std::ostream::operator<<(str,*pvVar8);
      local_58 = local_58 + 1;
    }
    local_64 = 0;
    while( true ) {
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->uValues);
      bVar1 = false;
      if (sVar7 != 0) {
        pVar3 = UniformType::getSize(&this->type);
        local_6c = pVar3.first;
        bVar1 = local_64 < local_6c;
      }
      if (!bVar1) break;
      if (local_64 != 0) {
        std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      }
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->uValues,(long)(arrayElement * local_2c + local_64));
      poVar5 = (ostream *)std::ostream::operator<<(str,*pvVar8);
      std::operator<<(poVar5,"u");
      local_64 = local_64 + 1;
    }
    std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,")");
  }
  return;
}

Assistant:

void streamValue(std::ostringstream& str, int arrayElement = 0, int column = 0) const
	{
		int arrayElementSize = type.getSize().first * type.getSize().second;

		str << type.refStr() << "(";

		if (type.getBaseType() == GL_SAMPLER)
		{
			for (size_t elem = 0; elem < 4; elem++)
			{
				if (elem)
					str << ", ";
				str << fValues[arrayElement * 4 + elem];
			}
			str << ")";
			return;
		}

		for (int elem = 0; fValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << fValues[arrayElement * arrayElementSize + column * type.getSize().first + elem] << ".0";
		}
		for (int elem = 0; iValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << iValues[arrayElement * arrayElementSize + elem];
		}
		for (int elem = 0; uValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << uValues[arrayElement * arrayElementSize + elem] << "u";
		}
		str << ")";
	}